

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter.c
# Opt level: O0

void aom_lpf_vertical_4_c(uint8_t *s,int pitch,uint8_t *blimit,uint8_t *limit,uint8_t *thresh)

{
  uint8_t *in_RCX;
  uint8_t *in_RDX;
  int in_ESI;
  uint8_t *in_RDI;
  uint8_t *in_R8;
  int8_t mask;
  uint8_t q1;
  uint8_t q0;
  uint8_t p0;
  uint8_t p1;
  int count;
  int i;
  int iVar1;
  int iVar2;
  uint8_t *local_8;
  
  iVar1 = 4;
  local_8 = in_RDI;
  for (iVar2 = 0; iVar2 < iVar1; iVar2 = iVar2 + 1) {
    filter_mask2(*in_RCX,*in_RDX,local_8[-2],local_8[-1],*local_8,local_8[1]);
    filter4((int8_t)((uint)in_ESI >> 0x18),(uint8_t)((uint)in_ESI >> 0x10),in_RDX,in_RCX,in_R8,
            (uint8_t *)CONCAT44(iVar2,iVar1));
    local_8 = local_8 + in_ESI;
  }
  return;
}

Assistant:

void aom_lpf_vertical_4_c(uint8_t *s, int pitch, const uint8_t *blimit,
                          const uint8_t *limit, const uint8_t *thresh) {
  int i;
  int count = 4;

  // loop filter designed to work using chars so that we can make maximum use
  // of 8 bit simd instructions.
  for (i = 0; i < count; ++i) {
    const uint8_t p1 = s[-2], p0 = s[-1];
    const uint8_t q0 = s[0], q1 = s[1];
    const int8_t mask = filter_mask2(*limit, *blimit, p1, p0, q0, q1);
    filter4(mask, *thresh, s - 2, s - 1, s, s + 1);
    s += pitch;
  }
}